

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O3

void amrex::average_down_edges(MultiFab *fine,MultiFab *crse,IntVect *ratio,int ngcrse)

{
  DistributionMapping *this;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FabArray<amrex::FArrayBox> *pFVar5;
  FabArray<amrex::FArrayBox> *pFVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  Periodicity *period;
  long lVar13;
  int iVar14;
  uint uVar15;
  Real facInv;
  double dVar16;
  int local_328;
  ulong local_310;
  long local_300;
  undefined8 local_2b0;
  int local_2a8;
  uint local_2a4;
  uint local_2a0;
  int local_29c;
  FabArray<amrex::FArrayBox> *local_290;
  FabArray<amrex::FArrayBox> *local_288;
  ulong local_280;
  long local_278;
  ulong local_270;
  double *local_268;
  double *local_260;
  undefined1 local_258 [24];
  pointer local_240;
  undefined8 uStack_238;
  int local_230;
  BoxArray local_218;
  MFIter mfi;
  
  uVar8 = 0;
  switch((fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar8 = *(uint *)&(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
                      m_op;
    break;
  default:
    uVar8 = *(uint *)((long)&(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.
                             m_bat.m_op + 4);
  }
  uVar15 = 0;
  do {
    if ((uVar8 >> (uVar15 & 0x1f) & 1) == 0) {
      if ((1 << ((byte)uVar15 & 0x1f) | uVar8) == 7) goto LAB_00484183;
      goto LAB_00484177;
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 3);
  uVar15 = 3;
LAB_00484177:
  Abort_host("average_down_edges: not face index type");
LAB_00484183:
  uVar8 = (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  this = &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  bVar7 = DistributionMapping::operator==
                    (this,&(crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                           distributionMap);
  if ((bVar7) &&
     ((fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
    MFIter::MFIter(&mfi,(FabArrayBase *)crse,true);
    pFVar5 = &fine->super_FabArray<amrex::FArrayBox>;
    pFVar6 = &crse->super_FabArray<amrex::FArrayBox>;
    if (mfi.currentIndex < mfi.endIndex) {
      do {
        local_288 = pFVar6;
        local_290 = pFVar5;
        pFVar6 = local_288;
        pFVar5 = local_290;
        MFIter::growntilebox((Box *)&local_2b0,&mfi,ngcrse);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_218,pFVar6,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_258,pFVar5,&mfi);
        if (0 < (int)uVar8) {
          local_270 = (ulong)local_2a4;
          local_280 = (ulong)local_2a0;
          local_310 = 0;
          do {
            iVar4 = local_2a8;
            if (local_2a8 <= local_29c) {
              do {
                if (local_2b0._4_4_ <= (int)local_2a0) {
                  uVar1 = ratio->vect[0];
                  uVar2 = ratio->vect[2];
                  uVar3 = ratio->vect[1];
                  local_278 = (long)(int)uVar3;
                  local_328 = uVar3 * local_2b0._4_4_;
                  local_300 = (long)local_2b0._4_4_;
                  do {
                    if ((int)local_2b0 <= (int)local_2a4) {
                      local_260 = (double *)
                                  (local_258._0_8_ +
                                  ((local_300 * local_278 - (long)uStack_238._4_4_) *
                                   local_258._8_8_ + (long)local_240 * local_310) * 8);
                      iVar9 = uVar2 * iVar4 - local_230;
                      lVar11 = (long)iVar9 * local_258._16_8_;
                      local_268 = (double *)
                                  (local_258._0_8_ + (lVar11 + (long)local_240 * local_310) * 8);
                      iVar14 = uVar1 * (int)local_2b0 - (int)uStack_238;
                      lVar13 = (long)(int)local_2b0;
                      do {
                        if (uVar15 == 2) {
                          if ((int)uVar2 < 1) {
                            dVar16 = 0.0;
                          }
                          else {
                            dVar16 = 0.0;
                            uVar12 = (ulong)uVar2;
                            iVar10 = iVar9;
                            do {
                              dVar16 = dVar16 + local_260[(lVar13 * (int)uVar1 -
                                                          (long)(int)uStack_238) +
                                                          local_258._16_8_ * (long)iVar10];
                              iVar10 = iVar10 + 1;
                              uVar12 = uVar12 - 1;
                            } while (uVar12 != 0);
                          }
                          dVar16 = dVar16 * (1.0 / (double)(int)uVar2);
LAB_00484520:
                          *(double *)
                           ((local_300 - local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) *
                            CONCAT44(local_218.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0],
                                     local_218.m_bat.m_op.m_bndryReg.m_typ.itype) * 8 +
                            CONCAT44(local_218.m_bat.m_op.m_indexType.m_typ.itype,
                                     local_218.m_bat.m_bat_type) +
                            ((long)iVar4 - (long)local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) *
                            local_218.m_bat.m_op._12_8_ * 8 +
                            local_218.m_bat.m_op._20_8_ * local_310 * 8 +
                           (lVar13 - local_218.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) * 8) = dVar16
                          ;
                        }
                        else {
                          if (uVar15 == 1) {
                            if ((int)uVar3 < 1) {
                              dVar16 = 0.0;
                            }
                            else {
                              dVar16 = 0.0;
                              uVar12 = (ulong)uVar3;
                              iVar10 = local_328 - uStack_238._4_4_;
                              do {
                                dVar16 = dVar16 + local_268[(lVar13 * (int)uVar1 -
                                                            (long)(int)uStack_238) +
                                                            local_258._8_8_ * (long)iVar10];
                                iVar10 = iVar10 + 1;
                                uVar12 = uVar12 - 1;
                              } while (uVar12 != 0);
                            }
                            dVar16 = dVar16 * (1.0 / (double)(int)uVar3);
                            goto LAB_00484520;
                          }
                          if (uVar15 == 0) {
                            dVar16 = 0.0;
                            uVar12 = (ulong)uVar1;
                            iVar10 = iVar14;
                            if (0 < (int)uVar1) {
                              do {
                                dVar16 = dVar16 + local_260[lVar11 + iVar10];
                                uVar12 = uVar12 - 1;
                                iVar10 = iVar10 + 1;
                              } while (uVar12 != 0);
                            }
                            dVar16 = dVar16 * (1.0 / (double)(int)uVar1);
                            goto LAB_00484520;
                          }
                        }
                        lVar13 = lVar13 + 1;
                        iVar14 = iVar14 + uVar1;
                      } while (local_2a4 + 1 != (int)lVar13);
                    }
                    local_300 = local_300 + 1;
                    local_328 = local_328 + uVar3;
                  } while (local_2a0 + 1 != (int)local_300);
                }
                bVar7 = iVar4 != local_29c;
                iVar4 = iVar4 + 1;
              } while (bVar7);
            }
            local_310 = local_310 + 1;
          } while (local_310 != uVar8);
        }
        MFIter::operator++(&mfi);
        pFVar5 = local_290;
        pFVar6 = local_288;
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
  }
  else {
    coarsen(&local_218,&(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,ratio);
    local_258._0_8_ = (double *)0x1;
    local_258._8_8_ = (Arena *)0x0;
    local_258._16_8_ = (pointer)0x0;
    local_240 = (pointer)0x0;
    uStack_238 = (pointer)0x0;
    local_2b0 = &PTR__FabFactory_00712918;
    MultiFab::MultiFab((MultiFab *)&mfi,&local_218,this,uVar8,ngcrse,(MFInfo *)local_258,
                       (FabFactory<amrex::FArrayBox> *)&local_2b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_258 + 0x10));
    BoxArray::~BoxArray(&local_218);
    average_down_edges(fine,(MultiFab *)&mfi,ratio,ngcrse);
    period = Periodicity::NonPeriodic();
    local_258._4_4_ = ngcrse;
    local_258._0_4_ = ngcrse;
    local_258._8_4_ = ngcrse;
    local_218.m_bat.m_bat_type = ngcrse;
    local_218.m_bat.m_op.m_indexType.m_typ.itype = (BATindexType)ngcrse;
    local_218.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)ngcrse;
    FabArray<amrex::FArrayBox>::ParallelCopy_nowait
              (&crse->super_FabArray<amrex::FArrayBox>,(FabArray<amrex::FArrayBox> *)&mfi,0,0,uVar8,
               (IntVect *)&local_218,(IntVect *)local_258,period,COPY,(CPC *)0x0,false);
    MultiFab::~MultiFab((MultiFab *)&mfi);
  }
  return;
}

Assistant:

void average_down_edges (const MultiFab& fine, MultiFab& crse,
                             const IntVect& ratio, int ngcrse)
    {
        AMREX_ASSERT(crse.nComp() == fine.nComp());
        AMREX_ASSERT(fine.ixType() == crse.ixType());
        const auto type = fine.ixType();
        int dir;
        for (dir = 0; dir < AMREX_SPACEDIM; ++dir) {
            if (type.cellCentered(dir)) break;
        }
        auto tmptype = type;
        tmptype.set(dir);
        if (dir >= AMREX_SPACEDIM || !tmptype.nodeCentered()) {
            amrex::Abort("average_down_edges: not face index type");
        }
        const int ncomp = crse.nComp();
        if (isMFIterSafe(fine, crse))
        {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && crse.isFusingCandidate()) {
                auto const& crsema = crse.arrays();
                auto const& finema = fine.const_arrays();
                ParallelFor(crse, IntVect(ngcrse), ncomp,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                {
                    amrex_avgdown_edges(i,j,k,n, crsema[box_no], finema[box_no], 0, 0, ratio, dir);
                });
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if(Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.growntilebox(ngcrse);
                    Array4<Real> const& crsearr = crse.array(mfi);
                    Array4<Real const> const& finearr = fine.const_array(mfi);

                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                    {
                        amrex_avgdown_edges(i,j,k,n, crsearr, finearr, 0, 0, ratio, dir);
                    });
                }
            }
        }
        else
        {
            MultiFab ctmp(amrex::coarsen(fine.boxArray(),ratio), fine.DistributionMap(),
                          ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            average_down_edges(fine, ctmp, ratio, ngcrse);
            crse.ParallelCopy(ctmp,0,0,ncomp,ngcrse,ngcrse);
        }
    }